

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O1

_Bool hashmap_scan(hashmap *map,_func__Bool_void_ptr_void_ptr *iter,void *udata)

{
  _Bool _Var1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  bVar5 = map->nbuckets == 0;
  if (!bVar5) {
    uVar3 = 0;
    do {
      lVar2 = map->bucketsz * uVar3;
      if ((*(short *)((long)map->buckets + lVar2 + 6) != 0) &&
         (_Var1 = (*iter)((void *)((long)map->buckets + lVar2 + 8),udata), !_Var1)) {
        return bVar5;
      }
      uVar3 = uVar3 + 1;
      bVar4 = uVar3 < map->nbuckets;
      bVar5 = !bVar4;
    } while (bVar4);
  }
  return bVar5;
}

Assistant:

bool hashmap_scan(struct hashmap *map, 
    bool (*iter)(const void *item, void *udata), void *udata)
{
    for (size_t i = 0; i < map->nbuckets; i++) {
        struct bucket *bucket = bucket_at(map, i);
        if (bucket->dib && !iter(bucket_item(bucket), udata)) {
            return false;
        }
    }
    return true;
}